

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

bool CoreML::checkSingleWeightType(WeightParams *param)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = 0 < (param->floatvalue_).current_size_;
  uVar2 = bVar1 + 1;
  if (((param->float16value_).ptr_)->_M_string_length == 0) {
    uVar2 = (uint)bVar1;
  }
  return ((uVar2 - (((param->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
         (uint)(((param->int8rawvalue_).ptr_)->_M_string_length == 0) == 1;
}

Assistant:

inline bool checkSingleWeightType(const Specification::WeightParams &param) {
        int numFilledIn = 0;
        if (param.floatvalue_size() > 0)
            numFilledIn++;
        if (param.float16value().size() > 0)
            numFilledIn++;
        if (param.rawvalue().size() > 0)
            numFilledIn++;
        if (param.int8rawvalue().size() > 0)
            numFilledIn++;
        return (numFilledIn == 1);
    }